

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

parser_error parse_class_effect(parser *p)

{
  wchar_t wVar1;
  long lVar2;
  long *plVar3;
  parser_error pVar4;
  void *pvVar5;
  effect *effect;
  long lVar6;
  long *plVar7;
  
  pvVar5 = parser_priv(p);
  if (pvVar5 != (void *)0x0) {
    wVar1 = *(wchar_t *)((long)pvVar5 + 0xf8);
    if (0 < (long)wVar1) {
      lVar2 = *(long *)((long)pvVar5 + 0x100);
      if ((lVar2 == 0) || (class_max_books < wVar1)) {
        __assert_fail("c->magic.books && c->magic.num_books <= class_max_books",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/init.c"
                      ,0xf03,"enum parser_error parse_class_effect(struct parser *)");
      }
      lVar6 = (long)wVar1 * 0x20;
      wVar1 = *(wchar_t *)(lVar2 + -0x14 + lVar6);
      if (0 < (long)wVar1) {
        lVar2 = *(long *)(lVar2 + lVar6 + -8);
        if ((lVar2 != 0) && (wVar1 <= book_max_spells)) {
          lVar6 = (long)wVar1 * 0x38;
          effect = (effect *)mem_zalloc(0x38);
          plVar3 = *(long **)(lVar2 + -0x28 + lVar6);
          if (plVar3 == (long *)0x0) {
            plVar7 = (long *)(lVar2 + lVar6 + -0x28);
          }
          else {
            do {
              plVar7 = plVar3;
              plVar3 = (long *)*plVar7;
            } while ((long *)*plVar7 != (long *)0x0);
          }
          *plVar7 = (long)effect;
          pVar4 = grab_effect_data(p,effect);
          return pVar4;
        }
        __assert_fail("book->spells && book->num_spells <= book_max_spells",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/init.c"
                      ,0xf09,"enum parser_error parse_class_effect(struct parser *)");
      }
    }
  }
  return PARSE_ERROR_MISSING_RECORD_HEADER;
}

Assistant:

static enum parser_error parse_class_effect(struct parser *p) {
	struct player_class *c = parser_priv(p);
	struct class_book *book;
	struct class_spell *spell;
	struct effect *effect, *new_effect;

	if (!c) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (c->magic.num_books < 1) {
		/*
		 * Either missing a magic directive for the class or didn't
		 * have a book directive after the magic directive.
		 */
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	assert(c->magic.books && c->magic.num_books <= class_max_books);
	book = &c->magic.books[c->magic.num_books - 1];
	if (book->num_spells < 1) {
		/* Missing a spell directive after the book directive. */
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	assert(book->spells && book->num_spells <= book_max_spells);
	spell = &book->spells[book->num_spells - 1];
	/* Go to the next vacant effect and set it to the new one  */
	new_effect = mem_zalloc(sizeof(*effect));
	if (spell->effect) {
		effect = spell->effect;
		while (effect->next) effect = effect->next;
		effect->next = new_effect;
	} else {
		spell->effect = new_effect;
	}
	/* Fill in the detail */
	return grab_effect_data(p, new_effect);
}